

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall ToggleButton::ToggleButton(ToggleButton *this,string *text)

{
  pointer pcVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pcVar1 = (text->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + text->_M_string_length);
  *(undefined8 *)((long)&(this->super_Button).super_Widget.x1 + 1) = 0;
  *(undefined8 *)((long)&(this->super_Button).super_Widget.x2 + 1) = 0;
  (this->super_Button).super_Widget.dialog = (Dialog *)0x0;
  (this->super_Button).super_Widget.x1 = 0;
  (this->super_Button).super_Widget.y1 = 0;
  (this->super_Button).super_Widget.grid_x = 0;
  (this->super_Button).super_Widget.grid_y = 0;
  (this->super_Button).super_Widget.grid_w = 0;
  (this->super_Button).super_Widget.grid_h = 0;
  (this->super_Button).super_Widget._vptr_Widget = (_func_int **)&PTR__Button_00113848;
  (this->super_Button).text._M_dataplus._M_p = (pointer)&(this->super_Button).text.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Button).text,local_38,local_30 + (long)local_38);
  (this->super_Button).pushed = false;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_Button).super_Widget._vptr_Widget = (_func_int **)&PTR__Button_001138e0;
  return;
}

Assistant:

ToggleButton::ToggleButton(std::string text) :
   Button(text)
{
}